

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

void ray_intersect_triangles_all
               (vec3 ro,vec3 rd,vec3 *points,int num_points,mat4 transform,float *t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  vec3 c;
  undefined1 auVar7 [16];
  _Bool _Var8;
  ulong uVar9;
  float *pfVar10;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar11;
  float fVar12;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar13;
  float fVar14;
  vec3 p;
  vec3 q;
  vec3 a;
  vec3 b;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  p.z = ro.z;
  auVar6._8_4_ = in_XMM0_Dc;
  auVar6._0_8_ = ro._0_8_;
  auVar6._12_4_ = in_XMM0_Dd;
  if (0 < num_points) {
    local_8c = transform.m[8];
    local_90 = transform.m[9];
    local_94 = transform.m[10];
    local_98 = transform.m[0xb];
    local_88._0_4_ = rd.x;
    local_88._4_4_ = rd.y;
    local_78._0_4_ = ro.x;
    local_78._4_4_ = ro.y;
    local_88._4_4_ = local_88._4_4_ + (float)local_78._4_4_;
    local_88._0_4_ = (float)local_88 + (float)local_78._0_4_;
    fStack_80 = in_XMM2_Dc + in_XMM0_Dc;
    fStack_7c = in_XMM2_Dd + in_XMM0_Dd;
    local_38 = transform.m[3];
    fStack_34 = transform.m[7];
    fStack_30 = transform.m[5];
    fStack_2c = transform.m[6];
    local_48 = transform.m[2];
    fStack_44 = transform.m[6];
    fStack_40 = transform.m[4];
    fStack_3c = transform.m[5];
    local_58 = transform.m[0];
    fStack_54 = transform.m[4];
    fStack_50 = transform.m[2];
    fStack_4c = transform.m[3];
    local_68 = transform.m[1];
    fStack_64 = transform.m[5];
    fStack_60 = transform.m[3];
    fStack_5c = transform.m[4];
    pfVar10 = &points[2].z;
    uVar9 = 0;
    local_78 = auVar6;
    do {
      auVar7 = local_78;
      auVar6 = _local_88;
      fVar13 = (float)*(undefined8 *)(pfVar10 + -8);
      fVar14 = (float)((ulong)*(undefined8 *)(pfVar10 + -8) >> 0x20);
      fVar1 = pfVar10[-6];
      fVar11 = (float)*(undefined8 *)(pfVar10 + -5);
      fVar12 = (float)((ulong)*(undefined8 *)(pfVar10 + -5) >> 0x20);
      fVar2 = pfVar10[-3];
      uVar4 = ((vec3 *)(pfVar10 + -2))->x;
      uVar5 = ((vec3 *)(pfVar10 + -2))->y;
      fVar3 = *pfVar10;
      a.x = fVar1 * local_48 + fVar13 * local_58 + fVar14 * local_68 + local_38;
      a.y = fVar1 * fStack_44 + fVar13 * fStack_54 + fVar14 * fStack_64 + fStack_34;
      a.z = fVar14 * local_90 + local_8c * fVar13 + local_94 * fVar1 + local_98;
      b.x = fVar2 * local_48 + fVar11 * local_58 + fVar12 * local_68 + local_38;
      b.y = fVar2 * fStack_44 + fVar11 * fStack_54 + fVar12 * fStack_64 + fStack_34;
      b.z = fVar12 * local_90 + local_8c * fVar11 + local_94 * fVar2 + local_98;
      local_9c = 3.4028235e+38;
      c.y = fVar3 * fStack_44 + (float)uVar4 * fStack_54 + (float)uVar5 * fStack_64 + fStack_34;
      c.x = fVar3 * local_48 + (float)uVar4 * local_58 + (float)uVar5 * local_68 + local_38;
      c.z = fVar3 * fStack_40 + (float)uVar4 * fStack_50 + (float)uVar5 * fStack_60 + fStack_30;
      p.x = (float)local_78._0_4_;
      p.y = (float)local_78._4_4_;
      q.z = rd.z + p.z;
      q.x = (float)local_88;
      q.y = local_88._4_4_;
      _local_88 = auVar6;
      local_78 = auVar7;
      _Var8 = intersect_segment_triangle(p,q,a,b,c,&local_9c);
      if (!_Var8) {
        local_9c = 3.4028235e+38;
      }
      *t = local_9c;
      uVar9 = uVar9 + 3;
      t = t + 1;
      pfVar10 = pfVar10 + 9;
    } while (uVar9 < (uint)num_points);
  }
  return;
}

Assistant:

void ray_intersect_triangles_all(vec3 ro, vec3 rd, vec3 *points, int num_points, mat4 transform, float *t) { 
    for (int i = 0; i < num_points; i += 3) {
        vec3 tp0 = points[i + 0];
        vec3 tp1 = points[i + 1];
        vec3 tp2 = points[i + 2];
        tp0 = vec3_apply_mat4(tp0, 1.0f, transform);
        tp1 = vec3_apply_mat4(tp1, 1.0f, transform);
        tp2 = vec3_apply_mat4(tp2, 1.0f, transform);

        float t0 = FLT_MAX;
        if (intersect_segment_triangle(ro, vec3_add(ro, rd), tp0, tp1, tp2, &t0)) {
            t[i/3] = t0;    
        }
        else {
            t[i/3] = FLT_MAX;
        }
    }
}